

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O1

error_code __thiscall
pstore::exchange::import_ns::rule::
push<pstore::exchange::import_ns::internal_fixup,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,pstore::gsl::not_null<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>*>>
          (rule *this,not_null<const_pstore::exchange::import_ns::string_mapping_*> args,
          not_null<std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_*>
          args_1)

{
  iterator *piVar1;
  not_null<context_*> ctxt;
  _Elt_pointer puVar2;
  undefined1 auVar3 [16];
  internal_fixup *this_00;
  ulong uVar4;
  pointer *__ptr;
  pointer __p;
  _Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false> local_38;
  _Head_base<0UL,_pstore::exchange::import_ns::internal_fixup_*,_false> local_30;
  
  ctxt.ptr_ = (this->context_).ptr_;
  this_00 = (internal_fixup *)operator_new(0x40);
  internal_fixup::internal_fixup
            (this_00,ctxt,(not_null<const_string_mapping_*>)args.ptr_,(fixups_pointer)args_1.ptr_);
  local_30._M_head_impl = (internal_fixup *)0x0;
  puVar2 = ((ctxt.ptr_)->stack).c.
           super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar2 == ((ctxt.ptr_)->stack).c.
                super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    local_38._M_head_impl = (rule *)this_00;
    std::
    deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
    ::
    _M_push_back_aux<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>
              ((deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
                *)&(ctxt.ptr_)->stack,
               (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
                *)&local_38);
  }
  else {
    (puVar2->_M_t).
    super___uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
    .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl =
         (rule *)this_00;
    local_38._M_head_impl = (rule *)0x0;
    piVar1 = &((ctxt.ptr_)->stack).c.
              super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  if ((internal_fixup *)local_38._M_head_impl != (internal_fixup *)0x0) {
    (**(code **)((long)((rule *)&(local_38._M_head_impl)->_vptr_rule)->_vptr_rule + 8))();
  }
  local_38._M_head_impl = (rule *)0x0;
  std::
  unique_ptr<pstore::exchange::import_ns::internal_fixup,_std::default_delete<pstore::exchange::import_ns::internal_fixup>_>
  ::~unique_ptr((unique_ptr<pstore::exchange::import_ns::internal_fixup,_std::default_delete<pstore::exchange::import_ns::internal_fixup>_>
                 *)&local_30);
  log_top(this,true);
  uVar4 = std::_V2::system_category();
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar4;
  return (error_code)(auVar3 << 0x40);
}

Assistant:

std::error_code push (Args... args) {
                    context_->stack.push (std::make_unique<T> (context_, args...));
                    this->log_top (true);
                    return {};
                }